

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

CppType __thiscall google::protobuf::MapValueRef::type(MapValueRef *this)

{
  LogMessage *this_00;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *in_stack_ffffffffffffff90;
  LogMessage *in_stack_ffffffffffffffa0;
  undefined1 local_40 [64];
  
  if (((int)in_RDI[1] == 0) || (*in_RDI == 0)) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffa0,(LogLevel_conflict)((ulong)local_40 >> 0x20),
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff90,
                         (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x43f593);
  }
  return *(CppType *)(in_RDI + 1);
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == 0 || data_ == NULL) {
      GOOGLE_LOG(FATAL) << "Protocol Buffer map usage error:\n"
                 << "MapValueRef::type MapValueRef is not initialized.";
    }
    return (FieldDescriptor::CppType)type_;
  }